

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_utf8_copy_num(char *dst,char *src,int dst_size,int num)

{
  int cursor;
  int iVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
                 ,0xadf,(uint)(0 < dst_size),"dst_size invalid");
  iVar1 = 0;
  do {
    cursor = iVar1;
    if ((src[cursor] == '\0') || (num < 1)) break;
    iVar1 = str_utf8_forward(src,cursor);
    num = num + -1;
  } while (iVar1 < dst_size);
  iVar1 = cursor + 1;
  if (dst_size <= cursor) {
    iVar1 = dst_size;
  }
  str_copy(dst,src,iVar1);
  return;
}

Assistant:

void str_utf8_copy_num(char *dst, const char *src, int dst_size, int num)
{
	int new_cursor;
	int cursor = 0;
	dbg_assert(dst_size > 0, "dst_size invalid");

	while(src[cursor] && num > 0)
	{
		new_cursor = str_utf8_forward(src, cursor);
		if(new_cursor >= dst_size)			// reserve 1 byte for the null termination
			break;
		else
			cursor = new_cursor;
		--num;
	}

	str_copy(dst, src, cursor < dst_size ? cursor+1 : dst_size);
}